

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

void duckdb::ArrowTypeExtension::PopulateArrowSchema
               (DuckDBArrowSchemaHolder *root_holder,ArrowSchema *child,LogicalType *duckdb_type,
               ClientContext *context,ArrowTypeExtension *extension)

{
  string *psVar1;
  char *__s;
  reference pvVar2;
  size_type sVar3;
  ulong __n;
  unique_ptr<char[],_std::default_delete<char>,_false> format;
  ArrowSchemaMetadata schema_metadata;
  _Head_base<0UL,_char_*,_false> local_f8;
  string local_f0;
  ArrowSchemaMetadata local_d0;
  string local_90;
  ArrowSchemaMetadata local_70;
  
  if (extension->populate_arrow_schema != (populate_arrow_schema_t)0x0) {
    (*extension->populate_arrow_schema)(root_holder,child,duckdb_type,context,extension);
    return;
  }
  psVar1 = &(extension->extension_metadata).arrow_format;
  ::std::__cxx11::string::string((string *)&local_d0,(string *)psVar1);
  __n = local_d0.schema_metadata_map._M_h._M_bucket_count + 1;
  __s = (char *)operator_new__(__n);
  switchD_014c3389::default(__s,0,__n);
  local_f8._M_head_impl = __s;
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::__cxx11::string::string((string *)&local_d0,(string *)psVar1);
  for (sVar3 = 0; local_d0.schema_metadata_map._M_h._M_bucket_count != sVar3; sVar3 = sVar3 + 1) {
    local_f8._M_head_impl[sVar3] =
         *(char *)((long)local_d0.schema_metadata_map._M_h._M_buckets + sVar3);
  }
  ::std::__cxx11::string::~string((string *)&local_d0);
  local_f8._M_head_impl[local_d0.schema_metadata_map._M_h._M_bucket_count] = '\0';
  ::std::
  vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
  ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
            ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
              *)&root_holder->extension_format,
             (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_f8);
  pvVar2 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                     (&root_holder->extension_format);
  child->format =
       (pvVar2->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
       super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  ArrowSchemaMetadata::ArrowSchemaMetadata(&local_d0);
  if ((extension->extension_metadata).vendor_name._M_string_length == 0) {
    ::std::__cxx11::string::string((string *)&local_f0,(string *)&extension->extension_metadata);
    ArrowSchemaMetadata::ArrowCanonicalType(&local_70,&local_f0);
    ArrowSchemaMetadata::operator=(&local_d0,&local_70);
    ArrowSchemaMetadata::~ArrowSchemaMetadata(&local_70);
  }
  else {
    ::std::__cxx11::string::string
              ((string *)&local_f0,(string *)&(extension->extension_metadata).type_name);
    ::std::__cxx11::string::string
              ((string *)&local_90,(string *)&(extension->extension_metadata).vendor_name);
    ArrowSchemaMetadata::NonCanonicalType(&local_70,&local_f0,&local_90);
    ArrowSchemaMetadata::operator=(&local_d0,&local_70);
    ArrowSchemaMetadata::~ArrowSchemaMetadata(&local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
  }
  ::std::__cxx11::string::~string((string *)&local_f0);
  ArrowSchemaMetadata::SerializeMetadata(&local_70);
  ::std::
  vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
  ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
            ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
              *)&root_holder->metadata_info,
             (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_70);
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_70);
  pvVar2 = vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_true>::back
                     (&root_holder->metadata_info);
  child->metadata =
       (pvVar2->super_unique_ptr<char[],_std::default_delete<char[]>_>)._M_t.
       super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  ArrowSchemaMetadata::~ArrowSchemaMetadata(&local_d0);
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_f8);
  return;
}

Assistant:

void ArrowTypeExtension::PopulateArrowSchema(DuckDBArrowSchemaHolder &root_holder, ArrowSchema &child,
                                             const LogicalType &duckdb_type, ClientContext &context,
                                             const ArrowTypeExtension &extension) {
	if (extension.populate_arrow_schema) {
		extension.populate_arrow_schema(root_holder, child, duckdb_type, context, extension);
		return;
	}

	auto format = make_unsafe_uniq_array<char>(extension.extension_metadata.GetArrowFormat().size() + 1);
	idx_t i = 0;
	for (const auto &c : extension.extension_metadata.GetArrowFormat()) {
		format[i++] = c;
	}
	format[i++] = '\0';
	// We do the default way of populating the schema
	root_holder.extension_format.emplace_back(std::move(format));

	child.format = root_holder.extension_format.back().get();
	ArrowSchemaMetadata schema_metadata;
	if (extension.extension_metadata.IsCanonical()) {
		schema_metadata = ArrowSchemaMetadata::ArrowCanonicalType(extension.extension_metadata.GetExtensionName());
	} else {
		schema_metadata = ArrowSchemaMetadata::NonCanonicalType(extension.extension_metadata.GetTypeName(),
		                                                        extension.extension_metadata.GetVendorName());
	}
	root_holder.metadata_info.emplace_back(schema_metadata.SerializeMetadata());
	child.metadata = root_holder.metadata_info.back().get();
}